

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

Id_t __thiscall Potassco::AspifTextOutput::Data::addCondition(Data *this,LitSpan *cond)

{
  LitVec *this_00;
  iterator iVar1;
  int iVar2;
  ulong in_RAX;
  Id_t IVar3;
  undefined8 local_28;
  
  this_00 = &this->conditions;
  iVar1._M_current =
       (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = in_RAX;
  if ((this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == iVar1._M_current) {
    local_28 = in_RAX & 0xffffffff;
    if (iVar1._M_current ==
        (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (this_00,iVar1,(int *)((long)&local_28 + 4));
    }
    else {
      *iVar1._M_current = 0;
      (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  if (cond->size == 0) {
    IVar3 = 0;
  }
  else {
    iVar1._M_current =
         (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    IVar3 = (Id_t)((ulong)((long)iVar1._M_current -
                          (long)(this->conditions).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
    iVar2 = (int)cond->size;
    local_28 = CONCAT44(local_28._4_4_,iVar2);
    if (iVar1._M_current ==
        (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,(int *)&local_28)
      ;
    }
    else {
      *iVar1._M_current = iVar2;
      (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    std::vector<int,std::allocator<int>>::_M_range_insert<int_const*>
              ((vector<int,std::allocator<int>> *)this_00,
               (this->conditions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,cond->first,cond->first + cond->size);
  }
  return IVar3;
}

Assistant:

Id_t addCondition(const LitSpan& cond) {
		if (conditions.empty()) { conditions.push_back(0); }
		if (empty(cond)) { return 0; }
		Id_t id = static_cast<Id_t>(conditions.size());
		conditions.push_back(static_cast<Lit_t>(size(cond)));
		conditions.insert(conditions.end(), begin(cond), end(cond));
		return id;
	}